

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O3

FuncInfo * PostVisitFunction(ParseNodeFnc *pnodeFnc,ByteCodeGenerator *byteCodeGenerator)

{
  byte *pbVar1;
  Type *pTVar2;
  undefined1 *puVar3;
  ushort uVar4;
  SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *pSVar5;
  ParseableFunctionInfo *pPVar6;
  Scope *pSVar7;
  ParseNode *pPVar8;
  Symbol *pSVar9;
  ParseNodeBlock *pPVar10;
  code *pcVar11;
  bool bVar12;
  BOOL BVar13;
  RegSlot RVar14;
  uint uVar15;
  Type *ppFVar16;
  FuncInfo *pFVar17;
  FuncInfo *pFVar18;
  undefined4 *puVar19;
  FunctionInfo *pFVar20;
  FunctionBody *pFVar21;
  undefined7 extraout_var;
  ParseNodeVar *pPVar22;
  ParseNodePtr pPVar23;
  ParseNodeParamPattern *pPVar24;
  Scope *pSVar25;
  char *in_RCX;
  Type this;
  byte bVar26;
  uint uVar27;
  Type this_00;
  ParseNodePtr this_01;
  Symbol *pSVar28;
  char funcExprWithName;
  uint uVar29;
  ulong uVar30;
  ParseNodeFnc *pPVar31;
  anon_class_16_2_de35cfdd handler;
  anon_class_16_2_de35cfdd handler_00;
  FuncInfo *local_60;
  FuncInfo *top;
  Symbol *local_50;
  undefined4 *local_48;
  ParseNodeFnc *local_40;
  uint local_34;
  
  pSVar5 = byteCodeGenerator->funcInfoStack;
  if ((SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)
      (pSVar5->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>).
      super_SListNodeBase<Memory::ArenaAllocator>.next == pSVar5) {
    this = (FuncInfo *)0x0;
  }
  else {
    ppFVar16 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                         (&pSVar5->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>);
    this = *ppFVar16;
  }
  local_60 = this;
  pFVar17 = (FuncInfo *)ParseNodeFnc::GetFuncSymbol(pnodeFnc);
  bVar12 = FuncInfo::IsGlobalFunction(this);
  uVar30 = 0;
  if ((pFVar17 != (FuncInfo *)0x0) && (!bVar12)) {
    uVar30 = ((ulong)*(byte *)((long)&pFVar17->alloc + 2) & 0xffffffffffffff20) >> 5;
  }
  BVar13 = FuncInfo::IsLambda(this);
  local_48 = (undefined4 *)CONCAT44(local_48._4_4_,(int)uVar30);
  top = pFVar17;
  local_40 = pnodeFnc;
  if (BVar13 == 0) {
    bVar12 = FuncAllowsDirectSuper(this,byteCodeGenerator);
    if (bVar12) goto LAB_008281b5;
  }
  else {
    pFVar18 = ByteCodeGenerator::FindEnclosingNonLambda(byteCodeGenerator);
    bVar12 = FuncInfo::IsGlobalFunction(pFVar18);
    if (bVar12) {
      pPVar6 = this->byteCodeFunction;
      pFVar20 = (pPVar6->super_FunctionProxy).functionInfo.ptr;
      if (pFVar20 == (FunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar19 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar19 = 1;
        in_RCX = "GetFunctionInfo()";
        bVar12 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                            ,0x529,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar12) goto LAB_00828f7f;
        *puVar19 = 0;
        pFVar20 = (pPVar6->super_FunctionProxy).functionInfo.ptr;
        pFVar17 = top;
      }
      if ((ParseableFunctionInfo *)(pFVar20->functionBodyImpl).ptr != pPVar6) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar19 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar19 = 1;
        in_RCX = "GetFunctionInfo()->GetFunctionProxy() == this";
        bVar12 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                            ,0x52a,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                            "GetFunctionInfo()->GetFunctionProxy() == this");
        if (!bVar12) goto LAB_00828f7f;
        *puVar19 = 0;
        pFVar20 = (pPVar6->super_FunctionProxy).functionInfo.ptr;
        pFVar17 = top;
      }
      pbVar1 = (byte *)((long)&pFVar20->attributes + 2);
      *pbVar1 = *pbVar1 | 4;
      uVar30 = (ulong)local_48 & 0xffffffff;
    }
    bVar12 = FuncAllowsDirectSuper(pFVar18,byteCodeGenerator);
    pnodeFnc = local_40;
    if (bVar12) {
LAB_008281b5:
      pTVar2 = &((this->byteCodeFunction->super_FunctionProxy).functionInfo.ptr)->attributes;
      *pTVar2 = *pTVar2 | AllowDirectSuper;
    }
  }
  funcExprWithName = (char)uVar30;
  if (funcExprWithName != '\0') {
    bVar12 = Js::ParseableFunctionInfo::IsFunctionParsed(this->byteCodeFunction);
    if ((bVar12) &&
       (pFVar21 = FuncInfo::GetParsedFunctionBody(this), (pFVar21->field_0x17a & 0x40) != 0)) {
      this->field_0xb5 = this->field_0xb5 | 2;
    }
    if (((ulong)pFVar17->alloc & 0x100000) != 0) {
      pFVar18 = (FuncInfo *)byteCodeGenerator;
      ByteCodeGenerator::ProcessCapturedSym(byteCodeGenerator,(Symbol *)pFVar17);
      this->field_0xb5 = this->field_0xb5 | 2;
      if (pnodeFnc->pnodeBody != (ParseNodePtr)0x0) {
        pFVar18 = this;
        pFVar21 = FuncInfo::GetParsedFunctionBody(this);
        pFVar21->field_0x17a = pFVar21->field_0x17a | 0x40;
      }
      ByteCodeGenerator::ProcessScopeWithCapturedSym
                ((ByteCodeGenerator *)pFVar18,pFVar17->currentChildScope);
    }
  }
  if ((pnodeFnc->super_ParseNode).nop == knopProg) {
LAB_0082828f:
    if ((((this->byteCodeFunction->super_FunctionProxy).field_0x46 & 1) != 0) &&
       ((byteCodeGenerator->flags & 0x400) != 0)) {
      Scope::SetIsObject(this->bodyScope);
    }
  }
  else {
    pSVar25 = this->bodyScope;
    if ((((pSVar25->field_0x44 & 2) == 0) &&
        ((((this->field_0xb4 & 6) != 0 ||
          (bVar12 = ByteCodeGenerator::NeedScopeObjectForArguments(byteCodeGenerator,this,pnodeFnc),
          bVar12)) || ((byteCodeGenerator->flags & 0x404) != 0)))) &&
       (Scope::SetIsObject(pSVar25), (this->field_0xb5 & 0x80) == 0)) {
      Scope::SetIsObject(this->paramScope);
    }
    if ((pnodeFnc->super_ParseNode).nop == knopProg) goto LAB_0082828f;
  }
  if (pnodeFnc->pnodeBody != (ParseNodePtr)0x0) {
    bVar12 = FuncInfo::IsGlobalFunction(this);
    if (!bVar12) {
      pSVar25 = this->paramScope;
      pSVar7 = this->bodyScope;
      if ((pSVar25 != (Scope *)0x0) && ((pSVar25->field_0x45 & 1) != 0)) {
        pSVar28 = pSVar25->m_symList;
        while (pSVar9 = pSVar28, pSVar9 != (Symbol *)0x0) {
          pSVar28 = pSVar9->next;
          if ((*(ushort *)&pSVar9->field_0x42 & 0x4010) == 0x10) {
            ByteCodeGenerator::ProcessCapturedSym(byteCodeGenerator,pSVar9);
          }
        }
        this->field_0xb4 = this->field_0xb4 | 0x40;
      }
      if ((pSVar7->field_0x45 & 1) != 0) {
        pSVar28 = pSVar7->m_symList;
        while (pSVar9 = pSVar28, pSVar9 != (Symbol *)0x0) {
          pSVar28 = pSVar9->next;
          if ((*(ushort *)&pSVar9->field_0x42 & 0x4010) == 0x10) {
            ByteCodeGenerator::ProcessCapturedSym(byteCodeGenerator,pSVar9);
          }
        }
        this->field_0xb4 = this->field_0xb4 | 0x40;
      }
      PostVisitBlock(pnodeFnc->pnodeBodyScope,byteCodeGenerator);
      PostVisitBlock(pnodeFnc->pnodeScopes,byteCodeGenerator);
      funcExprWithName = (char)local_48;
    }
    if ((((pnodeFnc->nestedCount != 0) || ((this->field_0xb4 & 0x82) != 0)) ||
        (byteCodeGenerator->dynamicScopeCount != 0)) || ((byteCodeGenerator->flags & 0x404) != 0)) {
      ppFVar16 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                           (&byteCodeGenerator->funcInfoStack->
                             super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>);
      *(uint *)&(*ppFVar16)->field_0xb4 = *(uint *)&(*ppFVar16)->field_0xb4 | 0x4000;
    }
    bVar12 = FuncInfo::IsGlobalFunction(this);
    if (bVar12) {
      bVar12 = FuncInfo::IsGlobalFunction(this);
      if ((!bVar12) && ((pnodeFnc->fncFlags & kFunctionIsModule) == kFunctionNone)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar19 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar19 = 1;
        bVar12 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                            ,0xb78,"(top->IsGlobalFunction() || pnodeFnc->IsModule())",
                            "top->IsGlobalFunction() || pnodeFnc->IsModule()");
        if (!bVar12) goto LAB_00828f7f;
        *puVar19 = 0;
      }
      if ((((this->byteCodeFunction->super_FunctionProxy).field_0x46 & 1) != 0) &&
         ((byteCodeGenerator->flags & 0x400) != 0)) {
        ppFVar16 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                             (&byteCodeGenerator->funcInfoStack->
                               super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>);
        *(uint *)&(*ppFVar16)->field_0xb4 = *(uint *)&(*ppFVar16)->field_0xb4 | 0x4000;
        ByteCodeGenerator::AssignFrameObjRegister(byteCodeGenerator);
        ByteCodeGenerator::AssignFrameDisplayRegister(byteCodeGenerator);
      }
    }
    else {
      uVar15 = *(uint *)&this->field_0xb4;
      if ((uVar15 & 2) == 0) {
        if ((uVar15 & 4) != 0) {
LAB_008284ea:
          funcExprWithName = (char)local_48;
          if ((uVar15 & 0x40) != 0) {
            ByteCodeGenerator::AssignFrameSlotsRegister(byteCodeGenerator);
            uVar15 = *(uint *)&this->field_0xb4;
          }
          goto LAB_00828503;
        }
        uVar29 = uVar15 & 8;
        if (uVar29 != 0) {
          bVar12 = ByteCodeGenerator::NeedScopeObjectForArguments(byteCodeGenerator,this,pnodeFnc);
          if (((uVar15 & 0x40) == 0) && (!bVar12)) goto LAB_008284bf;
          goto LAB_008284ea;
        }
        if ((uVar15 & 0x40) != 0) goto LAB_008284ea;
LAB_008284bf:
        if (this->funcExprScope == (Scope *)0x0) {
          if (-1 < (short)uVar15) goto LAB_008284ea;
        }
        else if ((-1 < (short)uVar15) || ((*(ushort *)&this->funcExprScope->field_0x44 & 0x10) != 0)
                ) goto LAB_008284ea;
LAB_008285a3:
        funcExprWithName = (char)local_48;
        if (uVar29 == 0) goto LAB_00828979;
      }
      else {
LAB_00828503:
        if (-1 < (short)uVar15) {
          ByteCodeGenerator::AssignParamSlotsRegister(byteCodeGenerator);
          uVar15 = *(uint *)&this->field_0xb4;
        }
        if (((((uVar15 & 6) != 0) ||
             (bVar12 = ByteCodeGenerator::NeedScopeObjectForArguments
                                 (byteCodeGenerator,this,this->root), bVar12)) ||
            ((byteCodeGenerator->flags & 0x404) != 0)) ||
           (((this->bodyScope->field_0x44 & 2) != 0 || ((this->paramScope->field_0x44 & 2) != 0))))
        {
          ByteCodeGenerator::AssignFrameObjRegister(byteCodeGenerator);
          uVar15 = *(uint *)&this->field_0xb4;
        }
        if (((uVar15 & 2) != 0) || (pnodeFnc->nestedCount != 0)) {
LAB_0082857a:
          ppFVar16 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                               (&byteCodeGenerator->funcInfoStack->
                                 super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>);
          *(uint *)&(*ppFVar16)->field_0xb4 = *(uint *)&(*ppFVar16)->field_0xb4 | 0x4000;
          ByteCodeGenerator::AssignFrameDisplayRegister(byteCodeGenerator);
          uVar29 = *(uint *)&this->field_0xb4 & 8;
          goto LAB_008285a3;
        }
        if ((uVar15 & 8) == 0) goto LAB_00828979;
        if ((pnodeFnc->pnodeParams != (ParseNodePtr)0x0) &&
           (bVar12 = (byteCodeGenerator->m_utf8SourceInfo->debugModeSource).ptr != (uchar *)0x0,
           in_RCX = (char *)CONCAT71((int7)((ulong)in_RCX >> 8),bVar12),
           bVar26 = byteCodeGenerator->m_utf8SourceInfo->field_0xa8,
           (byte)((bVar26 & 0x40) >> 6 & (bVar26 >> 5 | bVar12)) == 1)) goto LAB_0082857a;
      }
      local_50 = this->argumentsSymbol;
      if (local_50 == (Symbol *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar19 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar19 = 1;
        bVar12 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                            ,0xb46,"(argSym)","argSym");
        if (!bVar12) goto LAB_00828f7f;
        *puVar19 = 0;
      }
      else {
        if (this->bodyScope->scopeSlotCount != 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar19 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar19 = 1;
          in_RCX = "top->bodyScope->GetScopeSlotCount() == 0";
          bVar12 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                              ,0xb49,"(top->bodyScope->GetScopeSlotCount() == 0)",
                              "top->bodyScope->GetScopeSlotCount() == 0");
          if (!bVar12) goto LAB_00828f7f;
          *puVar19 = 0;
        }
        if (this->argsPlaceHolderSlotCount != 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar19 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar19 = 1;
          in_RCX = "top->argsPlaceHolderSlotCount == 0";
          bVar12 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                              ,0xb4a,"(top->argsPlaceHolderSlotCount == 0)",
                              "top->argsPlaceHolderSlotCount == 0");
          if (!bVar12) goto LAB_00828f7f;
          *puVar19 = 0;
        }
        ByteCodeGenerator::AssignRegister(byteCodeGenerator,local_50);
        local_34 = 0;
        bVar12 = ByteCodeGenerator::NeedScopeObjectForArguments(byteCodeGenerator,this,pnodeFnc);
        pPVar23 = (ParseNodePtr)CONCAT71(extraout_var,bVar12);
        if (bVar12) {
          uVar27 = 0;
          this_01 = pnodeFnc->pnodeParams;
          if (pnodeFnc->pnodeParams != (ParseNodePtr)0x0) {
            do {
              uVar15 = (int)CONCAT71((int7)((ulong)pPVar23 >> 8),this_01->nop) - 0x51;
              in_RCX = (char *)(ulong)uVar15;
              if ((byte)uVar15 < 3) {
                pPVar22 = ParseNode::AsParseNodeVar(this_01);
                pSVar28 = pPVar22->sym;
                if (pSVar28->scopeSlot != -1) {
                  this->argsPlaceHolderSlotCount = this->argsPlaceHolderSlotCount + 1;
                }
                pSVar28->scopeSlot = uVar27;
              }
              else if (this_01->nop == knopParamPattern) {
                this->argsPlaceHolderSlotCount = this->argsPlaceHolderSlotCount + 1;
              }
              uVar27 = uVar27 + 1;
              pPVar23 = ParseNode::GetFormalNext(this_01);
              this_01 = pPVar23;
            } while (pPVar23 != (ParseNodePtr)0x0);
            pPVar23 = (ParseNodePtr)0x0;
            local_34 = uVar27;
          }
          pPVar31 = local_40;
          pSVar28 = local_50;
          pPVar8 = local_40->pnodeRest;
          if (pPVar8 != (ParseNode *)0x0) {
            uVar15 = (int)CONCAT71((int7)((ulong)pPVar23 >> 8),pPVar8->nop) - 0x51;
            in_RCX = (char *)(ulong)uVar15;
            if ((byte)uVar15 < 3) {
              pPVar22 = ParseNode::AsParseNodeVar(pPVar8);
              pSVar9 = pPVar22->sym;
              if (pSVar9->scopeSlot != -1) {
                this->argsPlaceHolderSlotCount = this->argsPlaceHolderSlotCount + 1;
              }
              pSVar9->scopeSlot = uVar27;
            }
            else if (pPVar8->nop == knopParamPattern) {
              this->argsPlaceHolderSlotCount = this->argsPlaceHolderSlotCount + 1;
            }
            uVar27 = uVar27 + 1;
            local_34 = uVar27;
          }
          bVar12 = Symbol::NeedsSlotAlloc(pSVar28,byteCodeGenerator,this);
          if (bVar12) {
            if (pSVar28->scopeSlot != -1) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar19 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
              *puVar19 = 1;
              in_RCX = "argSym->GetScopeSlot() == Js::Constants::NoProperty";
              bVar12 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                                  ,0xb65,"(argSym->GetScopeSlot() == Js::Constants::NoProperty)",
                                  "argSym->GetScopeSlot() == Js::Constants::NoProperty");
              if (!bVar12) goto LAB_00828f7f;
              *puVar19 = 0;
              pSVar28 = local_50;
              pPVar31 = local_40;
            }
            local_34 = uVar27 + 1;
            pSVar28->scopeSlot = uVar27;
          }
          pPVar23 = pPVar31->pnodeParams;
          funcExprWithName = (char)local_48;
          if (pPVar23 != (ParseNodePtr)0x0) {
            do {
              if (pPVar23->nop == knopParamPattern) {
                pPVar24 = ParseNode::AsParseNodeParamPattern(pPVar23);
                handler.i = (uint *)in_RCX;
                handler.top = (FuncInfo **)&local_34;
                Parser::MapBindIdentifier<PostVisitFunction(ParseNodeFnc*,ByteCodeGenerator*)::__1>
                          ((Parser *)(pPVar24->super_ParseNodeUni).pnode1,(ParseNodePtr)&local_60,
                           handler);
              }
              pPVar23 = ParseNode::GetFormalNext(pPVar23);
            } while (pPVar23 != (ParseNodePtr)0x0);
          }
          pnodeFnc = local_40;
          pPVar8 = local_40->pnodeRest;
          if ((pPVar8 != (ParseNode *)0x0) && (pPVar8->nop == knopParamPattern)) {
            pPVar24 = ParseNode::AsParseNodeParamPattern(pPVar8);
            handler_00.i = (uint *)in_RCX;
            handler_00.top = (FuncInfo **)&local_34;
            Parser::MapBindIdentifier<PostVisitFunction(ParseNodeFnc*,ByteCodeGenerator*)::__1>
                      ((Parser *)(pPVar24->super_ParseNodeUni).pnode1,(ParseNodePtr)&local_60,
                       handler_00);
          }
        }
        this->paramScope->scopeSlotCount = local_34;
        if ((this->field_0xb4 & 0x10) == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar19 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar19 = 1;
          bVar12 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                              ,0xb6d,"(top->GetHasHeapArguments())","top->GetHasHeapArguments()");
          if (!bVar12) goto LAB_00828f7f;
          *puVar19 = 0;
        }
        bVar12 = ByteCodeGenerator::NeedScopeObjectForArguments(byteCodeGenerator,this,pnodeFnc);
        if ((bVar12) && ((pnodeFnc->fncFlags & kFunctionHasNonSimpleParameterList) == kFunctionNone)
           ) {
          puVar3 = &(this->byteCodeFunction->super_FunctionProxy).field_0x47;
          *puVar3 = *puVar3 & 0xfb;
        }
      }
    }
LAB_00828979:
    if (this->newTargetSymbol != (Symbol *)0x0) {
      ByteCodeGenerator::AssignRegister(byteCodeGenerator,this->newTargetSymbol);
    }
    pFVar17 = top;
    if (this->thisSymbol != (Symbol *)0x0) {
      ByteCodeGenerator::AssignRegister(byteCodeGenerator,this->thisSymbol);
      bVar12 = FuncInfo::IsGlobalFunction(this);
      if (bVar12) {
        ByteCodeGenerator::AssignNullConstRegister(byteCodeGenerator);
      }
    }
    if (this->superSymbol != (Symbol *)0x0) {
      ByteCodeGenerator::AssignRegister(byteCodeGenerator,this->superSymbol);
    }
    if (this->superConstructorSymbol != (Symbol *)0x0) {
      ByteCodeGenerator::AssignRegister(byteCodeGenerator,this->superConstructorSymbol);
    }
    if (this->importMetaSymbol != (Symbol *)0x0) {
      ByteCodeGenerator::AssignRegister(byteCodeGenerator,this->importMetaSymbol);
    }
    if ((pFVar17 == (FuncInfo *)0x0) && (funcExprWithName == '\x01')) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar19 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar19 = 1;
      bVar12 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                          ,0xb9f,"(!funcExprWithName || sym)","!funcExprWithName || sym");
      if (!bVar12) goto LAB_00828f7f;
      *puVar19 = 0;
    }
    if (funcExprWithName != '\0') {
      pSVar25 = this->funcExprScope;
      if (pSVar25 == (Scope *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar19 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar19 = 1;
        bVar12 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                            ,0xba2,"(top->funcExprScope)","top->funcExprScope");
        if (!bVar12) goto LAB_00828f7f;
        *puVar19 = 0;
        pSVar25 = this->funcExprScope;
      }
      if ((this->field_0xb4 & 6) != 0) {
        Scope::SetIsObject(pSVar25);
        pSVar25 = this->funcExprScope;
      }
      if ((pSVar25->field_0x44 & 2) != 0) {
        ppFVar16 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                             (&byteCodeGenerator->funcInfoStack->
                               super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>);
        RVar14 = FuncInfo::NextVarRegister(*ppFVar16);
        pSVar25->location = RVar14;
      }
    }
  }
  ByteCodeGenerator::EndBindFunction(byteCodeGenerator,(bool)funcExprWithName);
  bVar12 = FuncInfo::IsGlobalFunction(this);
  if (bVar12) {
    return this;
  }
  if ((this->field_0xb5 & 0x80) == 0) {
    if ((this->bodyScope->field_0x44 & 2) >> 1 != (this->paramScope->field_0x44 & 2) >> 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar19 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar19 = 1;
      bVar12 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                          ,0xbc0,"(top->bodyScope->GetIsObject() == top->paramScope->GetIsObject())"
                          ,"top->bodyScope->GetIsObject() == top->paramScope->GetIsObject()");
      if (bVar12) {
        *puVar19 = 0;
        Js::Throw::FatalInternalError(-0x7fffbffb);
      }
      goto LAB_00828f7f;
    }
  }
  else {
    Scope::MergeParamAndBodyScopes(pnodeFnc);
    Scope::RemoveParamScope(pnodeFnc);
  }
  pSVar5 = byteCodeGenerator->funcInfoStack;
  if ((SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)
      (pSVar5->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>).
      super_SListNodeBase<Memory::ArenaAllocator>.next == pSVar5) {
    this_00 = (FuncInfo *)0x0;
  }
  else {
    ppFVar16 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                         (&pSVar5->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>);
    this_00 = *ppFVar16;
  }
  pPVar6 = this_00->byteCodeFunction;
  bVar12 = Js::FunctionProxy::IsFunctionBody(&pPVar6->super_FunctionProxy);
  if (!bVar12) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar19 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar19 = 1;
    bVar12 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                        ,0x59e,"(IsFunctionBody())","IsFunctionBody()");
    if (!bVar12) goto LAB_00828f7f;
    *puVar19 = 0;
  }
  uVar15 = *(uint *)&pPVar6[2].super_FunctionProxy.auxPtrs.ptr;
  if (((local_40->fncFlags & kFunctionHasHomeObj) != kFunctionNone) &&
     (local_40->homeObjLocation == 0xffffffff)) {
    RVar14 = this_00->undefinedConstantRegister;
    if (RVar14 == 0xffffffff) {
      RVar14 = FuncInfo::NextConstRegister(this_00);
      this_00->undefinedConstantRegister = RVar14;
    }
    local_40->homeObjLocation = RVar14;
  }
  bVar12 = FuncInfo::IsGlobalFunction(this_00);
  if (bVar12) {
    if (((byteCodeGenerator->flags & 0x800) != 0) &&
       (byteCodeGenerator->parentScopeInfo == (ScopeInfo *)0x0)) {
      pSVar25 = FuncInfo::GetGlobalEvalBlockScope(this_00);
      if ((*(uint *)&pSVar25->field_0x44 >> 8 & 1) != 0) {
        *(ushort *)&pSVar25->field_0x44 = (ushort)*(uint *)&pSVar25->field_0x44 | 0x10;
      }
    }
  }
  else {
    if (((uVar15 >> 0x15 & 1) != 0) &&
       (((ulong)pPVar6[2].super_FunctionProxy.auxPtrs.ptr & 0x100000) != 0)) {
      Scope::SetIsObject(this_00->bodyScope);
      Scope::SetIsObject(this_00->paramScope);
    }
    bVar12 = ByteCodeGenerator::CanStackNestedFunc(byteCodeGenerator,this,false);
    if ((((!bVar12) || ((this->field_0xb4 & 6) != 0)) ||
        (bVar12 = ByteCodeGenerator::NeedScopeObjectForArguments(byteCodeGenerator,this,local_40),
        bVar12)) || ((byteCodeGenerator->flags & 0x404) != 0)) {
      FuncInfo::SetHasMaybeEscapedNestedFunc(this_00,L"Child");
    }
  }
  if ((this->field_0xb4 & 6) == 0) {
    if ((uVar15 >> 0x15 & 1) == 0) goto LAB_00828e42;
  }
  else {
    uVar15 = *(uint *)&this_00->field_0xb4 | 4;
    *(uint *)&this_00->field_0xb4 = uVar15;
    pPVar10 = byteCodeGenerator->currentBlock;
    if (pPVar10 != (ParseNodeBlock *)0x0) {
      if ((pPVar10->super_ParseNodeStmt).super_ParseNode.nop != knopBlock) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        local_48 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *local_48 = 1;
        bVar12 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                            ,0xbf5,"(currentBlock->nop == knopBlock)",
                            "currentBlock->nop == knopBlock");
        if (!bVar12) {
LAB_00828f7f:
          pcVar11 = (code *)invalidInstructionException();
          (*pcVar11)();
        }
        *local_48 = 0;
      }
      pPVar10->field_0x5c = pPVar10->field_0x5c | 8;
      uVar15 = *(uint *)&this_00->field_0xb4;
    }
    *(uint *)&this_00->field_0xb4 = uVar15 | 0x10;
    puVar3 = &(this_00->byteCodeFunction->super_FunctionProxy).field_0x45;
    *(ushort *)puVar3 = *(ushort *)puVar3 & 0xdfff;
    pbVar1 = (byte *)((long)&pPVar6[2].super_FunctionProxy.auxPtrs.ptr + 2);
    *pbVar1 = *pbVar1 | 0x20;
    if (this->funcExprScope != (Scope *)0x0) {
      Scope::SetIsObject(this->funcExprScope);
    }
    if (this_00->inArgsCount == 1) {
      ByteCodeGenerator::AssignNullConstRegister(byteCodeGenerator);
    }
  }
  if (((ulong)pPVar6[2].super_FunctionProxy.auxPtrs.ptr & 0x8000000) == 0) {
    Scope::ForceAllSymbolNonLocalReference(this_00->bodyScope,byteCodeGenerator);
    bVar12 = FuncInfo::IsGlobalFunction(this_00);
    if (!bVar12) {
      Scope::ForceAllSymbolNonLocalReference(this_00->paramScope,byteCodeGenerator);
    }
    pbVar1 = (byte *)((long)&pPVar6[2].super_FunctionProxy.auxPtrs.ptr + 3);
    *pbVar1 = *pbVar1 | 8;
  }
LAB_00828e42:
  pPVar31 = local_40;
  pFVar17 = local_60;
  if (((local_40->fncFlags & kFunctionIsGenerator) != kFunctionNone) &&
     (local_60->undefinedConstantRegister == 0xffffffff)) {
    RVar14 = FuncInfo::NextConstRegister(local_60);
    pFVar17->undefinedConstantRegister = RVar14;
  }
  if (((((pFVar17->root->fncFlags & (kFunctionIsAsync|kFunctionIsLambda|kFunctionIsAccessor)) ==
         kFunctionNone) && ((pFVar17->field_0xb4 & 6) != 0)) ||
      (BVar13 = FuncInfo::IsClassConstructor(pFVar17), BVar13 != 0)) &&
     ((BVar13 = FuncInfo::IsBaseClassConstructor(pFVar17), BVar13 == 0 &&
      (pFVar17->undefinedConstantRegister == 0xffffffff)))) {
    RVar14 = FuncInfo::NextConstRegister(pFVar17);
    pFVar17->undefinedConstantRegister = RVar14;
  }
  AssignFuncSymRegister(pPVar31,byteCodeGenerator,pFVar17);
  if ((pPVar31->pnodeBody != (ParseNodePtr)0x0) && ((~pPVar31->fncFlags & 0x28) == 0)) {
    pPVar6 = pFVar17->byteCodeFunction;
    uVar4 = *(ushort *)&(pPVar6->super_FunctionProxy).field_0x45;
    uVar15 = *(uint *)&pFVar17->field_0xb4;
    if ((uVar15 & 0x40) == 0) {
      bVar26 = 0;
    }
    else {
      bVar26 = pFVar17->paramScope->field_0x45 & 1;
    }
    if (((uVar4 >> 0xd & 1) != 0) && (1 < pFVar17->inArgsCount)) {
      if (bVar26 == 0) {
        if ((((uVar15 & 0x40) == 0) && ((byteCodeGenerator->flags & 0x400) == 0)) &&
           (((pPVar6->super_FunctionProxy).field_0x47 & 1) == 0)) {
          *(ushort *)&(pPVar6->super_FunctionProxy).field_0x45 = uVar4 & 0xbfff;
        }
      }
      else {
        *(uint *)&pFVar17->field_0xb4 = uVar15 | 0x10;
        puVar3 = &(pPVar6->super_FunctionProxy).field_0x46;
        *puVar3 = *puVar3 & 0xdf;
        bVar12 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,PerfHintPhase);
        if (bVar12) {
          pFVar21 = FuncInfo::GetParsedFunctionBody(pFVar17);
          WritePerfHint(HeapArgumentsDueToNonLocalRef,pFVar21,0);
        }
      }
    }
  }
  return pFVar17;
}

Assistant:

FuncInfo* PostVisitFunction(ParseNodeFnc* pnodeFnc, ByteCodeGenerator* byteCodeGenerator)
{
    // Assign function-wide registers such as local frame object, closure environment, etc., based on
    // observed attributes. Propagate attributes to the parent function (if any).
    FuncInfo *top = byteCodeGenerator->TopFuncInfo();
    Symbol *sym = pnodeFnc->GetFuncSymbol();
    bool funcExprWithName = !top->IsGlobalFunction() && sym && sym->GetIsFuncExpr();

    if (top->IsLambda())
    {
        FuncInfo *enclosingNonLambda = byteCodeGenerator->FindEnclosingNonLambda();

        if (enclosingNonLambda->IsGlobalFunction())
        {
            top->byteCodeFunction->SetEnclosedByGlobalFunc();
        }

        if (FuncAllowsDirectSuper(enclosingNonLambda, byteCodeGenerator))
        {
            top->byteCodeFunction->GetFunctionInfo()->SetAllowDirectSuper();
        }
    }
    else if (FuncAllowsDirectSuper(top, byteCodeGenerator))
    {
        top->byteCodeFunction->GetFunctionInfo()->SetAllowDirectSuper();
    }

    // If this is a named function expression and has deferred child, mark has non-local reference.
    if (funcExprWithName)
    {
        // If we are reparsing this function due to being in debug mode - we should restore the state of this from the earlier parse
        if (top->byteCodeFunction->IsFunctionParsed() && top->GetParsedFunctionBody()->HasFuncExprNameReference())
        {
            top->SetFuncExprNameReference(true);
        }
        if (sym->GetHasNonLocalReference())
        {
            // Before doing this, though, make sure there's no local symbol that hides the function name
            // from the nested functions. If a lookup starting at the current local scope finds some symbol
            // other than the func expr, then it's hidden. (See Win8 393618.)
            byteCodeGenerator->ProcessCapturedSym(sym);

            top->SetFuncExprNameReference(true);
            if (pnodeFnc->pnodeBody)
            {
                top->GetParsedFunctionBody()->SetFuncExprNameReference(true);
            }
            byteCodeGenerator->ProcessScopeWithCapturedSym(sym->GetScope());
        }
    }

    if (pnodeFnc->nop != knopProg
        && !top->bodyScope->GetIsObject()
        && byteCodeGenerator->NeedObjectAsFunctionScope(top, pnodeFnc))
    {
        // Even if it wasn't determined during visiting this function that we need a scope object, we still have a few conditions that may require one.
        top->bodyScope->SetIsObject();
        if (!top->IsBodyAndParamScopeMerged())
        {
            // If we have the function inside an eval then access to outer variables should go through scope object.
            // So we set the body scope as object and we need to set the param scope also as object in case of split scope.
            top->paramScope->SetIsObject();
        }
    }

    if (pnodeFnc->nop == knopProg
        && top->byteCodeFunction->GetIsStrictMode()
        && (byteCodeGenerator->GetFlags() & fscrEval))
    {
        // At global scope inside a strict mode eval, vars will not leak out and require a scope object (along with its parent.)
        top->bodyScope->SetIsObject();
    }

    if (pnodeFnc->pnodeBody)
    {
        if (!top->IsGlobalFunction())
        {
            auto fnProcess =
                [byteCodeGenerator, top](Symbol *const sym)
                {
                    if (sym->GetHasNonLocalReference() && !sym->GetIsModuleExportStorage())
                    {
                        byteCodeGenerator->ProcessCapturedSym(sym);
                    }
                };

            Scope *bodyScope = top->bodyScope;
            Scope *paramScope = top->paramScope;
            if (paramScope != nullptr)
            {
                if (paramScope->GetHasOwnLocalInClosure())
                {
                    paramScope->ForEachSymbol(fnProcess);
                    top->SetHasLocalInClosure(true);
                }
            }

            if (bodyScope->GetHasOwnLocalInClosure())
            {
                bodyScope->ForEachSymbol(fnProcess);
                top->SetHasLocalInClosure(true);
            }

            PostVisitBlock(pnodeFnc->pnodeBodyScope, byteCodeGenerator);
            PostVisitBlock(pnodeFnc->pnodeScopes, byteCodeGenerator);
        }

        // This function refers to the closure environment if:
        // 1. it has a child function (we'll pass the environment to the constructor when the child is created -
        //      even if it's not needed, it's as cheap as loading "null" from the library);
        // 2. it calls eval (and will use the environment to construct the scope chain to pass to eval);
        // 3. it refers to a local defined in a parent function;
        // 4. some parent calls eval;
        // 5. we're in an event handler;
        // 6. the function was declared inside a "with";
        // 7. we're in an eval expression.
        if (pnodeFnc->nestedCount != 0 ||
            top->GetCallsEval() ||
            top->GetHasClosureReference() ||
            byteCodeGenerator->InDynamicScope() ||
            (byteCodeGenerator->GetFlags() & (fscrImplicitThis | fscrEval)))
        {
            byteCodeGenerator->SetNeedEnvRegister();
        }

        // This function needs to construct a local frame on the heap if it is not the global function (even in eval) and:
        // 1. it calls eval, which may refer to or declare any locals in this frame;
        // 2. a child calls eval (which may refer to locals through a closure);
        // 3. it uses non-strict mode "arguments", so the arguments have to be put in a closure;
        // 4. it defines a local that is used by a child function (read from a closure).
        // 5. it is a main function that's wrapped in a function expression scope but has locals used through
        //    a closure (used in forReference function call cases in a with for example).
        if (!top->IsGlobalFunction())
        {
            if (top->GetCallsEval() ||
                top->GetChildCallsEval() ||
                (top->GetHasArguments() && byteCodeGenerator->NeedScopeObjectForArguments(top, pnodeFnc)) ||
                top->GetHasLocalInClosure() ||
                (top->funcExprScope && top->funcExprScope->GetMustInstantiate()) ||
                // When we have split scope normally either eval will be present or the GetHasLocalInClosure will be true as one of the formal is
                // captured. But when we force split scope or split scope happens due to some other reasons we have to make sure we allocate frame
                // slot register here.
                (!top->IsBodyAndParamScopeMerged()))
            {
                if (!top->GetCallsEval() && top->GetHasLocalInClosure())
                {
                    byteCodeGenerator->AssignFrameSlotsRegister();
                }

                if (!top->IsBodyAndParamScopeMerged())
                {
                    byteCodeGenerator->AssignParamSlotsRegister();
                }

                if (byteCodeGenerator->NeedObjectAsFunctionScope(top, top->root)
                    || top->bodyScope->GetIsObject()
                    || top->paramScope->GetIsObject())
                {
                    byteCodeGenerator->AssignFrameObjRegister();
                }

                // The function also needs to construct a frame display if:
                // 1. it calls eval;
                // 2. it has a child function.
                // 3. When has arguments and in debug mode. So that frame display be there along with frame object register.
                if (top->GetCallsEval() ||
                    pnodeFnc->nestedCount != 0
                    || (top->GetHasArguments()
                        && (pnodeFnc->pnodeParams != nullptr)
                        && byteCodeGenerator->IsInDebugMode()))
                {
                    byteCodeGenerator->SetNeedEnvRegister(); // This to ensure that Env should be there when the FrameDisplay register is there.
                    byteCodeGenerator->AssignFrameDisplayRegister();
                }
            }

            if (top->GetHasArguments())
            {
                Symbol *argSym = top->GetArgumentsSymbol();
                Assert(argSym);
                if (argSym)
                {
                    Assert(top->bodyScope->GetScopeSlotCount() == 0);
                    Assert(top->argsPlaceHolderSlotCount == 0);
                    byteCodeGenerator->AssignRegister(argSym);
                    uint i = 0;
                    auto setArgScopeSlot = [&](ParseNode *pnodeArg)
                    {
                        if (pnodeArg->IsVarLetOrConst())
                        {
                            Symbol* sym = pnodeArg->AsParseNodeVar()->sym;
                            if (sym->GetScopeSlot() != Js::Constants::NoProperty)
                            {
                                top->argsPlaceHolderSlotCount++; // Same name args appeared before
                            }
                            sym->SetScopeSlot(i);
                        }
                        else if (pnodeArg->nop == knopParamPattern)
                        {
                            top->argsPlaceHolderSlotCount++;
                        }
                        i++;
                    };

                    // We need to include the rest as well -as it will get slot assigned.
                    if (byteCodeGenerator->NeedScopeObjectForArguments(top, pnodeFnc))
                    {
                        MapFormals(pnodeFnc, setArgScopeSlot);
                        if (argSym->NeedsSlotAlloc(byteCodeGenerator, top))
                        {
                            Assert(argSym->GetScopeSlot() == Js::Constants::NoProperty);
                            argSym->SetScopeSlot(i++);
                        }
                        MapFormalsFromPattern(pnodeFnc, setArgScopeSlot);
                    }

                    top->paramScope->SetScopeSlotCount(i);

                    Assert(top->GetHasHeapArguments());
                    if (byteCodeGenerator->NeedScopeObjectForArguments(top, pnodeFnc)
                        && !pnodeFnc->HasNonSimpleParameterList())
                    {
                        top->byteCodeFunction->SetHasImplicitArgIns(false);
                    }
                }
            }
        }
        else
        {
            Assert(top->IsGlobalFunction() || pnodeFnc->IsModule());
            // eval is called in strict mode
            bool newScopeForEval = (top->byteCodeFunction->GetIsStrictMode() && (byteCodeGenerator->GetFlags() & fscrEval));

            if (newScopeForEval)
            {
                byteCodeGenerator->SetNeedEnvRegister();
                byteCodeGenerator->AssignFrameObjRegister();
                byteCodeGenerator->AssignFrameDisplayRegister();
            }
        }

        if (top->GetNewTargetSymbol())
        {
            byteCodeGenerator->AssignRegister(top->GetNewTargetSymbol());
        }
        if (top->GetThisSymbol())
        {
            byteCodeGenerator->AssignRegister(top->GetThisSymbol());

            // Indirect eval has a 'this' binding and needs to load from null
            if (top->IsGlobalFunction())
            {
                byteCodeGenerator->AssignNullConstRegister();
            }
        }
        if (top->GetSuperSymbol())
        {
            byteCodeGenerator->AssignRegister(top->GetSuperSymbol());
        }
        if (top->GetSuperConstructorSymbol())
        {
            byteCodeGenerator->AssignRegister(top->GetSuperConstructorSymbol());
        }
        if (top->GetImportMetaSymbol())
        {
            byteCodeGenerator->AssignRegister(top->GetImportMetaSymbol());
        }

        Assert(!funcExprWithName || sym);
        if (funcExprWithName)
        {
            Assert(top->funcExprScope);
            // If the func expr may be accessed via eval, force the func expr scope into an object.
            if (top->GetCallsEval() || top->GetChildCallsEval())
            {
                top->funcExprScope->SetIsObject();
            }
            if (top->funcExprScope->GetIsObject())
            {
                top->funcExprScope->SetLocation(byteCodeGenerator->NextVarRegister());
            }
        }
    }

    byteCodeGenerator->EndBindFunction(funcExprWithName);

    // If the "child" is the global function, we're done.
    if (top->IsGlobalFunction())
    {
        return top;
    }

    if (top->IsBodyAndParamScopeMerged())
    {
        Scope::MergeParamAndBodyScopes(pnodeFnc);
        Scope::RemoveParamScope(pnodeFnc);
    }
    else
    {
        // A param and body scope exist for the same function, they
        // should both either be using scope slots or scope objects.
        Assert_FailFast(top->bodyScope->GetIsObject() == top->paramScope->GetIsObject());
    }

    FuncInfo* const parentFunc = byteCodeGenerator->TopFuncInfo();

    Js::FunctionBody * parentFunctionBody = parentFunc->byteCodeFunction->GetFunctionBody();
    Assert(parentFunctionBody != nullptr);
    bool setHasNonLocalReference = parentFunctionBody->HasAllNonLocalReferenced();

    // This is required for class constructors as will be able to determine the actual home object register only after emitting InitClass
    if (pnodeFnc->HasHomeObj() && pnodeFnc->GetHomeObjLocation() == Js::Constants::NoRegister)
    {
        pnodeFnc->SetHomeObjLocation(parentFunc->AssignUndefinedConstRegister());
    }

    // If we have any deferred child, we need to instantiate the fake global block scope if it is not empty
    if (parentFunc->IsGlobalFunction())
    {
        if (byteCodeGenerator->IsEvalWithNoParentScopeInfo())
        {
            Scope * globalEvalBlockScope = parentFunc->GetGlobalEvalBlockScope();
            if (globalEvalBlockScope->GetHasOwnLocalInClosure())
            {
                globalEvalBlockScope->SetMustInstantiate(true);
            }
        }
    }
    else
    {
        if (setHasNonLocalReference)
        {
            // All locals are already marked as non-locals-referenced. Mark the parent as well.
            if (parentFunctionBody->HasSetIsObject())
            {
                // Updated the current function, as per the previous stored info.
                parentFunc->GetBodyScope()->SetIsObject();
                parentFunc->GetParamScope()->SetIsObject();
            }
        }
        // Propagate HasMaybeEscapedNestedFunc
        if (!byteCodeGenerator->CanStackNestedFunc(top, false) ||
            byteCodeGenerator->NeedObjectAsFunctionScope(top, pnodeFnc))
        {
            parentFunc->SetHasMaybeEscapedNestedFunc(DebugOnly(_u("Child")));
        }
    }

    if (top->GetCallsEval() || top->GetChildCallsEval())
    {
        parentFunc->SetChildCallsEval(true);
        ParseNodeBlock *currentBlock = byteCodeGenerator->GetCurrentBlock();
        if (currentBlock)
        {
            Assert(currentBlock->nop == knopBlock);
            currentBlock->SetChildCallsEval(true);
        }
        parentFunc->SetHasHeapArguments(true);
        setHasNonLocalReference = true;
        parentFunctionBody->SetAllNonLocalReferenced(true);

        Scope * const funcExprScope = top->funcExprScope;
        if (funcExprScope)
        {
            // If we have the body scope as an object, the outer function expression scope also needs to be an object to propagate the name.
            funcExprScope->SetIsObject();
        }

        if (parentFunc->inArgsCount == 1)
        {
            // If no formals to function, no need to create the propertyid array
            byteCodeGenerator->AssignNullConstRegister();
        }
    }

    if (setHasNonLocalReference && !parentFunctionBody->HasDoneAllNonLocalReferenced())
    {
        parentFunc->GetBodyScope()->ForceAllSymbolNonLocalReference(byteCodeGenerator);
        if (!parentFunc->IsGlobalFunction())
        {
            parentFunc->GetParamScope()->ForceAllSymbolNonLocalReference(byteCodeGenerator);
        }
        parentFunctionBody->SetHasDoneAllNonLocalReferenced(true);
    }

    if (pnodeFnc->IsGenerator())
    {
        top->AssignUndefinedConstRegister();
    }

    if ((top->root->IsConstructor() && (top->GetCallsEval() || top->GetChildCallsEval())) || top->IsClassConstructor())
    {
        if (!top->IsBaseClassConstructor())
        {
            // Derived class constructors need to check undefined against explicit return statements.
            top->AssignUndefinedConstRegister();
        }
    }

    AssignFuncSymRegister(pnodeFnc, byteCodeGenerator, top);

    if (pnodeFnc->pnodeBody && pnodeFnc->HasReferenceableBuiltInArguments() && pnodeFnc->UsesArguments() &&
        pnodeFnc->HasHeapArguments())
    {
        bool doStackArgsOpt = top->byteCodeFunction->GetDoBackendArgumentsOptimization();

        bool hasAnyParamInClosure = top->GetHasLocalInClosure() && top->GetParamScope()->GetHasOwnLocalInClosure();

        if ((doStackArgsOpt && top->inArgsCount > 1))
        {
            if (doStackArgsOpt && hasAnyParamInClosure)
            {
                top->SetHasHeapArguments(true, false /*= Optimize arguments in backend*/);
#ifdef PERF_HINT
                if (PHASE_TRACE1(Js::PerfHintPhase))
                {
                    WritePerfHint(PerfHints::HeapArgumentsDueToNonLocalRef, top->GetParsedFunctionBody(), 0);
                }
#endif
            }
            else if (!top->GetHasLocalInClosure() && !(byteCodeGenerator->GetFlags() & fscrEval) && !top->byteCodeFunction->IsEval())
            {
                //Scope object creation instr will be a MOV NULL instruction in the Lowerer - if we still decide to do StackArgs after Globopt phase.
                //Note that if we're in eval, scoped ldfld/stfld will traverse the whole frame display, including this slot, so it can't be null.
                top->byteCodeFunction->SetDoScopeObjectCreation(false);
            }
        }
    }
    return top;
}